

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

int CompareWords(void *p1,void *p2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*p2 <= *p1) {
    uVar1 = (uint)(*p2 < *p1);
  }
  return uVar1;
}

Assistant:

int CompareWords( void * p1, void * p2 )
{
    word Word1 = *(word *)p1;
    word Word2 = *(word *)p2;
    if ( Word1 < Word2 )
        return -1;
    if ( Word1 > Word2 )
        return 1;
    return 0;
}